

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O1

int ** Amap_LibLookupTableAlloc(Vec_Ptr_t *vVec,int fVerbose)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int **ppiVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar7 = vVec->nSize;
  lVar9 = (long)iVar7;
  if (0 < lVar9) {
    lVar5 = 0;
    do {
      iVar7 = iVar7 + *(int *)((long)vVec->pArray[lVar5] + 4);
      lVar5 = lVar5 + 1;
    } while (lVar9 != lVar5);
  }
  ppiVar4 = (int **)malloc(((long)iVar7 + lVar9 * 8) * 4);
  *ppiVar4 = (int *)(ppiVar4 + lVar9 * 4);
  if (vVec->nSize < 1) {
    iVar8 = 0;
  }
  else {
    uVar6 = 0;
    iVar8 = 0;
    do {
      pvVar3 = vVec->pArray[uVar6];
      ppiVar4[uVar6] = *ppiVar4 + iVar8;
      iVar1 = *(int *)((long)pvVar3 + 4);
      if (fVerbose != 0) {
        printf("%d : ",uVar6 & 0xffffffff);
      }
      if (*(int *)((long)pvVar3 + 4) < 1) {
        lVar9 = 0;
      }
      else {
        lVar9 = 0;
        do {
          uVar2 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar9 * 4);
          ppiVar4[uVar6][lVar9] = uVar2;
          if (fVerbose != 0) {
            printf("%d(%d) ",(ulong)(uVar2 & 0xffff),(ulong)(uint)((int)uVar2 >> 0x10));
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)pvVar3 + 4));
      }
      if (fVerbose != 0) {
        putchar(10);
      }
      iVar8 = iVar8 + iVar1 + 1;
      ppiVar4[uVar6][lVar9] = 0;
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)vVec->nSize);
  }
  if (iVar8 != iVar7) {
    __assert_fail("nTotal == nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/amap/amapUniq.c"
                  ,0x133,"int **Amap_LibLookupTableAlloc(Vec_Ptr_t *, int)");
  }
  return ppiVar4;
}

Assistant:

int ** Amap_LibLookupTableAlloc( Vec_Ptr_t * vVec, int fVerbose )
{
    Vec_Int_t * vOne;
    int ** pRes, * pBuffer;
    int i, k, nTotal, nSize, nEntries, Value;
    // count the total size
    nEntries = nSize = Vec_PtrSize( vVec );
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
        nEntries += Vec_IntSize(vOne);
    pBuffer = ABC_ALLOC( int, nSize * sizeof(void *) + nEntries );
    pRes = (int **)pBuffer;
    pRes[0] = pBuffer + nSize * sizeof(void *);
    nTotal = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vVec, vOne, i )
    {
        pRes[i] = pRes[0] + nTotal;
        nTotal += Vec_IntSize(vOne) + 1;
        if ( fVerbose )
        printf( "%d : ", i );
        Vec_IntForEachEntry( vOne, Value, k )
        {
            pRes[i][k] = Value;
            if ( fVerbose )
            printf( "%d(%d) ", Value&0xffff, Value>>16 );
        }
        if ( fVerbose )
        printf( "\n" );
        pRes[i][k] = 0;
    }
    assert( nTotal == nEntries );
    return pRes;
}